

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AttitudeQuaternionEKF.cpp
# Opt level: O1

bool __thiscall
iDynTree::AttitudeQuaternionEKF::ekfComputeJacobianH
          (AttitudeQuaternionEKF *this,VectorDynSize *x,MatrixDynSize *H)

{
  double *pdVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  size_t sVar5;
  undefined8 *puVar6;
  double *pdVar7;
  undefined4 *puVar8;
  ulong *puVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  Index index_1;
  ulong uVar16;
  char *pcVar17;
  bool bVar18;
  ulong uVar19;
  PointerType ptr;
  undefined8 *puVar20;
  double dVar21;
  MatrixDynSize dhacc_by_dq;
  MatrixDynSize local_f0 [40];
  double local_c8;
  ulong uStack_c0;
  double local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined4 local_98;
  uint uStack_94;
  ulong uStack_90;
  undefined1 local_88 [16];
  undefined4 local_78;
  uint uStack_74;
  undefined4 uStack_70;
  uint uStack_6c;
  double local_60;
  undefined4 local_58;
  uint uStack_54;
  undefined4 uStack_50;
  uint uStack_4c;
  undefined4 local_48;
  uint uStack_44;
  undefined4 uStack_40;
  uint uStack_3c;
  
  sVar5 = iDynTree::VectorDynSize::size();
  if (sVar5 != this->m_state_size) {
    pcVar17 = "state size mismatch";
LAB_00161954:
    iDynTree::reportError("AttitudeQuaternionEKF","computejacobianH",pcVar17);
    return false;
  }
  sVar5 = iDynTree::MatrixDynSize::rows();
  if ((sVar5 != this->m_output_size) ||
     (sVar5 = iDynTree::MatrixDynSize::cols(), sVar5 != this->m_state_size)) {
    pcVar17 = "jacobian matrix size mismatch";
    goto LAB_00161954;
  }
  iDynTree::MatrixDynSize::zero();
  puVar6 = (undefined8 *)iDynTree::VectorDynSize::data();
  iDynTree::VectorDynSize::size();
  uStack_90 = puVar6[1];
  local_98 = (undefined4)*puVar6;
  uStack_94 = (uint)((ulong)*puVar6 >> 0x20);
  local_a8 = (double)puVar6[2];
  uStack_a0 = puVar6[3];
  iDynTree::MatrixDynSize::MatrixDynSize(local_f0);
  iDynTree::MatrixDynSize::resize((ulong)local_f0,3);
  pdVar7 = (double *)iDynTree::MatrixDynSize::operator()((ulong)local_f0,2);
  *pdVar7 = local_a8;
  pdVar7 = (double *)iDynTree::MatrixDynSize::operator()((ulong)local_f0,0);
  *pdVar7 = local_a8;
  puVar8 = (undefined4 *)iDynTree::MatrixDynSize::operator()((ulong)local_f0,1);
  local_48 = (undefined4)uStack_a0;
  uStack_44 = uStack_a0._4_4_;
  uStack_40 = (undefined4)uStack_a0;
  uStack_3c = uStack_a0._4_4_;
  uStack_74 = uStack_a0._4_4_ ^ 0x80000000;
  uStack_6c = uStack_a0._4_4_ ^ 0x80000000;
  local_78 = (undefined4)uStack_a0;
  uStack_70 = (undefined4)uStack_a0;
  *puVar8 = (undefined4)uStack_a0;
  puVar8[1] = uStack_74;
  puVar6 = (undefined8 *)iDynTree::MatrixDynSize::operator()((ulong)local_f0,0);
  *puVar6 = CONCAT44(uStack_74,local_78);
  puVar9 = (ulong *)iDynTree::MatrixDynSize::operator()((ulong)local_f0,1);
  local_88._8_4_ = (int)uStack_90;
  local_88._0_8_ = uStack_90;
  local_88._12_4_ = (int)(uStack_90 >> 0x20);
  local_c8 = (double)(uStack_90 ^ 0x8000000000000000);
  uStack_c0 = uStack_90 ^ 0x8000000000000000;
  *puVar9 = (ulong)local_c8;
  puVar9 = (ulong *)iDynTree::MatrixDynSize::operator()((ulong)local_f0,0);
  *puVar9 = (ulong)local_c8;
  puVar8 = (undefined4 *)iDynTree::MatrixDynSize::operator()((ulong)local_f0,2);
  local_c8 = -(double)CONCAT44(uStack_94,local_98);
  uStack_c0 = uStack_90 ^ 0x8000000000000000;
  *puVar8 = local_98;
  puVar8[1] = uStack_94 ^ 0x80000000;
  pdVar7 = (double *)iDynTree::MatrixDynSize::operator()((ulong)local_f0,1);
  *pdVar7 = local_c8;
  puVar6 = (undefined8 *)iDynTree::MatrixDynSize::operator()((ulong)local_f0,0);
  *puVar6 = CONCAT44(uStack_94,local_98);
  puVar8 = (undefined4 *)iDynTree::MatrixDynSize::operator()((ulong)local_f0,1);
  uStack_54 = local_a8._4_4_ ^ 0x80000000;
  uStack_4c = (uint)((ulong)uStack_a0 >> 0x20) ^ 0x80000000;
  uStack_50 = (undefined4)uStack_a0;
  local_58 = (undefined4)local_a8;
  *puVar8 = (undefined4)local_a8;
  puVar8[1] = uStack_54;
  puVar6 = (undefined8 *)iDynTree::MatrixDynSize::operator()((ulong)local_f0,2);
  *puVar6 = local_88._0_8_;
  puVar6 = (undefined8 *)iDynTree::MatrixDynSize::operator()((ulong)local_f0,2);
  *puVar6 = CONCAT44(uStack_74,local_78);
  dVar2 = (this->m_gravity_direction).super_Vector3.m_data[2];
  if ((dVar2 != -1.0) || (NAN(dVar2))) {
    if ((dVar2 != 1.0) || (NAN(dVar2))) {
      iDynTree::reportError
                ("AttitudeQuaternionEKF","computejacobianH",
                 "filter assumes gravity pointing upward or downward only");
      bVar18 = false;
      goto LAB_00161c2f;
    }
    uVar10 = iDynTree::MatrixDynSize::data();
    lVar11 = iDynTree::MatrixDynSize::rows();
    lVar12 = iDynTree::MatrixDynSize::cols();
    uVar13 = lVar12 * lVar11;
    uVar16 = uVar13;
    if (((uVar10 & 7) == 0) &&
       (uVar16 = (ulong)((uint)(uVar10 >> 3) & 1), (long)uVar13 <= (long)uVar16)) {
      uVar16 = uVar13;
    }
    lVar11 = uVar13 - uVar16;
    if (0 < (long)uVar16) {
      uVar19 = 0;
      do {
        *(double *)(uVar10 + uVar19 * 8) = *(double *)(uVar10 + uVar19 * 8) * -2.0;
        uVar19 = uVar19 + 1;
      } while (uVar16 != uVar19);
    }
    lVar12 = (lVar11 - (lVar11 >> 0x3f) & 0xfffffffffffffffeU) + uVar16;
    if (1 < lVar11) {
      do {
        pdVar7 = (double *)(uVar10 + uVar16 * 8);
        dVar2 = pdVar7[1];
        pdVar1 = (double *)(uVar10 + uVar16 * 8);
        *pdVar1 = *pdVar7 * -2.0;
        pdVar1[1] = dVar2 * -2.0;
        uVar16 = uVar16 + 2;
      } while ((long)uVar16 < lVar12);
    }
    if (lVar12 < (long)uVar13) {
      do {
        *(double *)(uVar10 + lVar12 * 8) = *(double *)(uVar10 + lVar12 * 8) * -2.0;
        lVar12 = lVar12 + 1;
      } while (uVar13 - lVar12 != 0);
    }
  }
  else {
    uVar10 = iDynTree::MatrixDynSize::data();
    lVar11 = iDynTree::MatrixDynSize::rows();
    lVar12 = iDynTree::MatrixDynSize::cols();
    uVar13 = lVar12 * lVar11;
    uVar16 = uVar13;
    if (((uVar10 & 7) == 0) &&
       (uVar16 = (ulong)((uint)(uVar10 >> 3) & 1), (long)uVar13 <= (long)uVar16)) {
      uVar16 = uVar13;
    }
    lVar11 = uVar13 - uVar16;
    if (0 < (long)uVar16) {
      uVar19 = 0;
      do {
        dVar2 = *(double *)(uVar10 + uVar19 * 8);
        *(double *)(uVar10 + uVar19 * 8) = dVar2 + dVar2;
        uVar19 = uVar19 + 1;
      } while (uVar16 != uVar19);
    }
    lVar12 = (lVar11 - (lVar11 >> 0x3f) & 0xfffffffffffffffeU) + uVar16;
    if (1 < lVar11) {
      do {
        pdVar7 = (double *)(uVar10 + uVar16 * 8);
        dVar21 = *pdVar7;
        dVar2 = pdVar7[1];
        dVar2 = dVar2 + dVar2;
        auVar3._8_4_ = SUB84(dVar2,0);
        auVar3._0_8_ = dVar21 + dVar21;
        auVar3._12_4_ = (int)((ulong)dVar2 >> 0x20);
        *(undefined1 (*) [16])(uVar10 + uVar16 * 8) = auVar3;
        uVar16 = uVar16 + 2;
      } while ((long)uVar16 < lVar12);
    }
    if (lVar12 < (long)uVar13) {
      do {
        dVar2 = *(double *)(uVar10 + lVar12 * 8);
        *(double *)(uVar10 + lVar12 * 8) = dVar2 + dVar2;
        lVar12 = lVar12 + 1;
      } while (uVar13 - lVar12 != 0);
    }
  }
  lVar11 = iDynTree::MatrixDynSize::data();
  iDynTree::MatrixDynSize::rows();
  lVar12 = iDynTree::MatrixDynSize::cols();
  lVar14 = iDynTree::MatrixDynSize::data();
  iDynTree::MatrixDynSize::rows();
  lVar15 = iDynTree::MatrixDynSize::cols();
  puVar6 = (undefined8 *)(lVar14 + 0x10);
  puVar20 = (undefined8 *)(lVar11 + 0x10);
  lVar11 = 3;
  do {
    uVar4 = puVar20[-1];
    puVar6[-2] = puVar20[-2];
    puVar6[-1] = uVar4;
    uVar4 = puVar20[1];
    *puVar6 = *puVar20;
    puVar6[1] = uVar4;
    puVar20 = puVar20 + lVar12;
    puVar6 = puVar6 + lVar15;
    lVar11 = lVar11 + -1;
  } while (lVar11 != 0);
  bVar18 = true;
  if (this->m_output_size == 4) {
    pdVar7 = (double *)iDynTree::MatrixDynSize::operator()((ulong)H,3);
    dVar2 = (double)CONCAT44(uStack_44,local_48);
    local_b0 = (double)local_88._0_8_ * local_a8 + (double)CONCAT44(uStack_94,local_98) * dVar2;
    dVar21 = dVar2 * dVar2 + local_a8 * local_a8;
    dVar21 = 1.0 - (dVar21 + dVar21);
    local_60 = local_b0 * local_b0 * 4.0 + dVar21 * dVar21;
    local_c8 = (dVar21 + dVar21) / local_60;
    *pdVar7 = dVar2 * local_c8;
    pdVar7 = (double *)iDynTree::MatrixDynSize::operator()((ulong)H,3);
    *pdVar7 = local_a8 * local_c8;
    pdVar7 = (double *)iDynTree::MatrixDynSize::operator()((ulong)H,3);
    local_b0 = (local_b0 * -8.0) / local_60;
    *pdVar7 = (double)local_88._0_8_ * local_c8 + (double)CONCAT44(uStack_54,local_58) * local_b0;
    pdVar7 = (double *)iDynTree::MatrixDynSize::operator()((ulong)H,3);
    *pdVar7 = (double)CONCAT44(uStack_94,local_98) * local_c8 +
              local_b0 * (double)CONCAT44(uStack_74,local_78);
  }
LAB_00161c2f:
  iDynTree::MatrixDynSize::~MatrixDynSize(local_f0);
  return bVar18;
}

Assistant:

bool iDynTree::AttitudeQuaternionEKF::ekfComputeJacobianH(iDynTree::VectorDynSize& x, iDynTree::MatrixDynSize& H)
{
    using iDynTree::toEigen;

    if (x.size() != m_state_size)
    {
        reportError("AttitudeQuaternionEKF", "computejacobianH", "state size mismatch");
        return false;
    }

    if (H.rows() != m_output_size || H.cols() != m_state_size)
    {
        reportError("AttitudeQuaternionEKF", "computejacobianH", "jacobian matrix size mismatch");
        return false;
    }

    H.zero();
    iDynTree::UnitQuaternion q;
    toEigen(q) = toEigen(x).block<4,1>(0, 0);

    iDynTree::MatrixDynSize dhacc_by_dq;
    dhacc_by_dq.resize(3, 4);
    dhacc_by_dq(0, 0) = dhacc_by_dq(2, 2) = q(2);
    dhacc_by_dq(0, 1) = dhacc_by_dq(1, 2) = -q(3);
    dhacc_by_dq(0, 3) = dhacc_by_dq(1, 0) = -q(1);
    dhacc_by_dq(1, 1) = dhacc_by_dq(2, 0) = -q(0);
    dhacc_by_dq(0, 2) = q(0);
    dhacc_by_dq(1, 3) = -q(2);
    dhacc_by_dq(2, 1) = q(1);
    dhacc_by_dq(2, 3) = -q(3);

    if (m_gravity_direction(2) == -1)
    {
        toEigen(dhacc_by_dq) *= 2;
    }
    else if (m_gravity_direction(2) == 1)
    {
        toEigen(dhacc_by_dq) *= -2;
    }
    else
    {
        reportError("AttitudeQuaternionEKF", "computejacobianH", "filter assumes gravity pointing upward or downward only");
        return false;
    }

    toEigen(H).block<3, 4>(0, 0) = toEigen(dhacc_by_dq);

    if (m_output_size == output_dimensions_with_magnetometer)
    {
        double q0q3{q(0)*q(3)};
        double q1q2{q(1)*q(2)};
        double q2squared{q(2)*q(2)};
        double q3squared{q(3)*q(3)};
        double common_factor{(1 - 2*(q2squared + q3squared))};
        double common_factorSquared{common_factor*common_factor};
        double q0q3plusq1q2Squared{((q0q3+q1q2)*(q0q3+q1q2))};
        double denominator{(4*q0q3plusq1q2Squared) + (common_factorSquared)};

        double multiple{(2*common_factor/denominator)};
        double factor{(-8*(q0q3 + q1q2))/denominator};

        H(3, 0) = q(3)*multiple;
        H(3, 1) = q(2)*multiple;
        H(3, 1) = (q(1)*multiple) - (q(2)*factor);
        H(3, 2) = (q(0)*multiple) - (q(3)*factor);
    }

    return true;
}